

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

bool slang::ast::Lookup::isAccessibleFrom(Symbol *target,Symbol *sourceScope)

{
  Scope *this;
  Symbol *pSVar1;
  Symbol *in_RSI;
  Symbol *in_RDI;
  Type *targetType;
  Type *sourceType;
  Symbol *parentScope;
  bool local_1;
  
  this = Symbol::getParentScope(in_RDI);
  pSVar1 = Scope::asSymbol(this);
  if (in_RSI == pSVar1) {
    local_1 = true;
  }
  else if (pSVar1->kind == ClassType) {
    Symbol::as<slang::ast::Type>((Symbol *)0x740e73);
    Symbol::as<slang::ast::Type>((Symbol *)0x740e82);
    local_1 = Type::isAssignmentCompatible((Type *)target,(Type *)sourceScope);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Lookup::isAccessibleFrom(const Symbol& target, const Symbol& sourceScope) {
    auto& parentScope = target.getParentScope()->asSymbol();
    if (&sourceScope == &parentScope)
        return true;

    if (parentScope.kind != SymbolKind::ClassType)
        return false;

    auto& sourceType = sourceScope.as<Type>();
    auto& targetType = parentScope.as<Type>();
    return targetType.isAssignmentCompatible(sourceType);
}